

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_owner_parse.c
# Opt level: O2

int int_in_list(int i,int *l,size_t n)

{
  int *piVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    if (n == sVar2) {
      failure("%d",i);
      return 0;
    }
    piVar1 = l + sVar2;
    sVar2 = sVar2 + 1;
  } while (*piVar1 != i);
  return 1;
}

Assistant:

static int
int_in_list(int i, const int *l, size_t n)
{
	while (n-- > 0)
		if (*l++ == i)
			return (1);
	failure("%d", i);
	return (0);
}